

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Vector3f pbrt::SampleTrowbridgeReitzVisibleArea(Vector3f *w,Float alpha_x,Float alpha_y,Point2f *u)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  float fVar4;
  undefined1 in_register_00001204 [60];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar14 [64];
  float fVar15;
  Vector3<float> VVar16;
  Tuple3<pbrt::Vector3,_float> TVar17;
  Tuple3<pbrt::Vector3,_float> local_c8;
  undefined1 local_b8 [16];
  float local_a0;
  float local_9c;
  undefined1 local_98 [12];
  float fStack_8c;
  Tuple3<pbrt::Vector3,_float> local_88;
  undefined1 local_78 [12];
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  Tuple3<pbrt::Vector3,_float> local_48;
  undefined1 local_38 [8];
  float fStack_30;
  float fStack_2c;
  undefined1 local_28 [8];
  float fStack_20;
  float fStack_1c;
  Tuple3<pbrt::Vector3,_float> local_18;
  undefined1 extraout_var [60];
  undefined1 auVar12 [56];
  
  auVar14._4_60_ = in_register_00001244;
  auVar14._0_4_ = alpha_y;
  auVar6._4_60_ = in_register_00001204;
  auVar6._0_4_ = alpha_x;
  uVar1 = (w->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar2 = (w->super_Tuple3<pbrt::Vector3,_float>).y;
  local_88.z = (w->super_Tuple3<pbrt::Vector3,_float>).z;
  _local_28 = vinsertps_avx(auVar6._0_16_,auVar14._0_16_,0x10);
  auVar5._0_4_ = (float)uVar1 * local_28._0_4_;
  auVar5._4_4_ = (float)uVar2 * local_28._4_4_;
  auVar5._8_4_ = local_28._8_4_ * 0.0;
  auVar5._12_4_ = local_28._12_4_ * 0.0;
  auVar12 = ZEXT856(auVar5._8_8_);
  local_88._0_8_ = vmovlps_avx(auVar5);
  VVar16 = Normalize<float>((Vector3<float> *)&local_88);
  local_c8.z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar12;
  local_c8._0_8_ = vmovlps_avx(auVar7._0_16_);
  if (0.99999 <= local_c8.z) {
    auVar9 = ZEXT464(0x3f800000);
    local_88.z = 0.0;
  }
  else {
    local_18.x = 0.0;
    local_18.y = 0.0;
    local_18.z = 1.0;
    VVar16 = Cross<float>((Vector3<float> *)&local_18,(Vector3<float> *)&local_c8);
    local_48.z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar8._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar12;
    local_48._0_8_ = vmovlps_avx(auVar8._0_16_);
    VVar16 = Normalize<float>((Vector3<float> *)&local_48);
    local_88.z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar9._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar9._8_56_ = auVar12;
  }
  auVar12 = auVar9._8_56_;
  local_88._0_8_ = vmovlps_avx(auVar9._0_16_);
  VVar16 = Cross<float>((Vector3<float> *)&local_c8,(Vector3<float> *)&local_88);
  local_9c = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar12;
  _local_38 = auVar10._0_16_;
  fVar4 = (u->super_Tuple2<pbrt::Point2,_float>).x;
  if (fVar4 < 0.0) {
    local_b8._0_4_ = sqrtf(fVar4);
  }
  else {
    auVar5 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
    local_b8._0_4_ = auVar5._0_4_;
  }
  local_98._0_4_ = (u->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855;
  fVar4 = cosf((float)local_98._0_4_);
  local_68 = ZEXT416((uint)(fVar4 * (float)local_b8._0_4_));
  local_98._0_4_ = sinf((float)local_98._0_4_);
  local_98._0_4_ = (float)local_98._0_4_ * (float)local_b8._0_4_;
  fVar4 = (local_c8.z + 1.0) * 0.5;
  local_78._0_4_ = 1.0 - fVar4;
  auVar5 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),local_68,local_68);
  local_b8._0_4_ = auVar5._0_4_;
  if ((float)local_b8._0_4_ < 0.0) {
    auVar11._0_4_ = sqrtf((float)local_b8._0_4_);
    auVar11._4_60_ = extraout_var;
    auVar13 = auVar11._0_16_;
    auVar5 = ZEXT416((uint)local_b8._0_4_);
  }
  else {
    auVar13 = vsqrtss_avx(auVar5,auVar5);
  }
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)((float)local_98._0_4_ * fVar4)),
                            ZEXT416((uint)local_78._0_4_),auVar13);
  fVar4 = (float)local_68._0_4_ * local_88.z;
  auVar5 = vfnmadd231ss_fma(auVar5,auVar13,auVar13);
  auVar5 = vmaxss_avx(auVar5,ZEXT816(0) << 0x40);
  local_b8 = vsqrtss_avx(auVar5,auVar5);
  local_78._0_4_ = local_88.x;
  local_78._4_4_ = local_88.y;
  stack0xffffffffffffff90 = 0;
  local_98._0_4_ = local_c8.x;
  local_98._4_4_ = local_c8.y;
  stack0xffffffffffffff70 = 0;
  local_a0 = local_b8._0_4_ * local_c8.z;
  if (SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
      ::reg == '\0') {
    local_58 = auVar13;
    iVar3 = __cxa_guard_acquire(&SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
                                 ::reg);
    auVar13 = local_58;
    if (iVar3 != 0) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
                  ::reg,SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
                        ::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                 (PixelAccumFunc)0x0);
      __cxa_guard_release(&SampleTrowbridgeReitzVisibleArea(pbrt::Vector3<float>const&,float,float,pbrt::Point2<float>const&)
                           ::reg);
      auVar13 = local_58;
    }
  }
  fVar15 = auVar13._0_4_;
  *(long *)(in_FS_OFFSET + -0x720) = *(long *)(in_FS_OFFSET + -0x720) + 1;
  fVar4 = fVar15 * local_9c + fVar4 + local_a0;
  if ((fVar4 == 0.0) && (!NAN(fVar4))) {
    *(long *)(in_FS_OFFSET + -0x728) = *(long *)(in_FS_OFFSET + -0x728) + 1;
  }
  auVar5 = vmaxss_avx(ZEXT416((uint)fVar4),ZEXT416(0x358637bd));
  auVar13._0_4_ =
       ((float)local_68._0_4_ * (float)local_78._0_4_ + fVar15 * (float)local_38._0_4_ +
       (float)local_b8._0_4_ * (float)local_98._0_4_) * (float)local_28._0_4_;
  auVar13._4_4_ =
       ((float)local_68._0_4_ * (float)local_78._4_4_ + fVar15 * (float)local_38._4_4_ +
       (float)local_b8._0_4_ * (float)local_98._4_4_) * (float)local_28._4_4_;
  auVar13._8_4_ =
       ((float)local_68._0_4_ * (float)local_78._8_4_ + fVar15 * fStack_30 +
       (float)local_b8._0_4_ * (float)local_98._8_4_) * fStack_20;
  auVar13._12_4_ =
       ((float)local_68._0_4_ * fStack_6c + fVar15 * fStack_2c + (float)local_b8._0_4_ * fStack_8c)
       * fStack_1c;
  local_48._0_8_ = vmovlps_avx(auVar13);
  local_48.z = auVar5._0_4_;
  TVar17 = (Tuple3<pbrt::Vector3,_float>)Normalize<float>((Vector3<float> *)&local_48);
  return (Vector3f)TVar17;
}

Assistant:

PBRT_CPU_GPU
inline Vector3f SampleTrowbridgeReitzVisibleArea(const Vector3f &w, Float alpha_x,
                                                 Float alpha_y, const Point2f &u) {
    // Section 3.2: transforming the view direction to the hemisphere
    // configuration
    Vector3f wh = Normalize(Vector3f(alpha_x * w.x, alpha_y * w.y, w.z));

    // Section 4.1: orthonormal basis. Can't use CoordinateSystem() since
    // T1 has to be in the tangent plane w.r.t. (0,0,1).
    Vector3f T1 =
        (wh.z < 0.99999f) ? Normalize(Cross(Vector3f(0, 0, 1), wh)) : Vector3f(1, 0, 0);
    Vector3f T2 = Cross(wh, T1);

    // Section 4.2: parameterization of the projected area
    Float r = std::sqrt(u[0]);
    Float phi = 2 * Pi * u[1];
    Float t1 = r * std::cos(phi), t2 = r * std::sin(phi);
    Float s = 0.5f * (1 + wh.z);
    t2 = (1 - s) * std::sqrt(1 - t1 * t1) + s * t2;

    // Section 4.3: reprojection onto hemisphere
    Vector3f nh =
        t1 * T1 + t2 * T2 + std::sqrt(std::max<Float>(0, 1 - t1 * t1 - t2 * t2)) * wh;

    // Section 3.4: transforming the normal back to the ellipsoid configuration
    CHECK_RARE(1e-6, nh.z == 0);
    return Normalize(
        Vector3f(alpha_x * nh.x, alpha_y * nh.y, std::max<Float>(1e-6f, nh.z)));
}